

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::init(Texture3DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  int extraout_EAX;
  RenderTarget *pRVar2;
  Texture3D *this_00;
  NotSupportedError *this_01;
  ulong uVar3;
  int levelNdx;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint depth;
  deUint32 step;
  Vector<float,_4> res;
  TextureFormatInfo fmtInfo;
  RGBA local_b4;
  ulong local_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  char local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  TextureFormat local_78;
  TextureFormatInfo local_70;
  
  local_78 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&local_70,&local_78);
  uVar5 = this->m_width;
  uVar7 = this->m_height;
  uVar6 = uVar7;
  if ((int)uVar7 < (int)uVar5) {
    uVar6 = uVar5;
  }
  depth = this->m_depth;
  if ((int)uVar6 <= (int)depth) {
    uVar6 = depth;
  }
  if (uVar6 == 0) {
    uVar4 = 0x20;
  }
  else {
    uVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  if (this->m_coordType == COORDTYPE_PROJECTED) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (0 < pRVar2->m_numSamples) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_a8 = (undefined1  [8])local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,
                 "Projected lookup validation not supported in multisample config","");
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_a8);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    uVar5 = this->m_width;
    uVar7 = this->m_height;
    depth = this->m_depth;
  }
  this_00 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar5,
             uVar7,depth);
  this->m_texture = this_00;
  if (uVar6 != 0) {
    uVar4 = 0x1f - uVar4;
    uVar8 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar8;
    }
    local_b0 = uVar3 * 0x28 + 0x28;
    uVar5 = 0;
    levelNdx = 0;
    do {
      uVar7 = 0xff;
      if (uVar5 < 0xff) {
        uVar7 = uVar5;
      }
      uVar7 = (uVar7 << 8 | uVar7) ^ 0xffffff00;
      if ((int)uVar5 < 0) {
        uVar7 = 0xffffff00;
      }
      tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,levelNdx);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_b4.m_value = uVar7;
      tcu::RGBA::toVec(&local_b4);
      fStack_a0 = local_70.lookupScale.m_data[2] * fStack_80 + local_70.lookupBias.m_data[2];
      fStack_9c = local_70.lookupScale.m_data[3] * fStack_7c + local_70.lookupBias.m_data[3];
      local_a8._4_4_ = local_70.lookupScale.m_data[1] * fStack_84 + local_70.lookupBias.m_data[1];
      local_a8._0_4_ = local_70.lookupScale.m_data[0] * local_88 + local_70.lookupBias.m_data[0];
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + uVar8 + -8),
                 (Vec4 *)local_a8);
      levelNdx = levelNdx + 1;
      uVar5 = uVar5 + (int)(short)(0xff / (int)(short)uVar4);
      uVar8 = uVar8 + 0x28;
    } while (local_b0 != uVar8);
    this_00 = this->m_texture;
  }
  glu::Texture3D::upload(this_00);
  return extraout_EAX;
}

Assistant:

void Texture3DMipmapCase::init (void)
{
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(m_internalFormat);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth))+1;

	if (m_coordType == COORDTYPE_PROJECTED && m_context.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (0xff << 16) | (dec << 8) | inc;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}